

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

xmlPatternPtr xmlPatterncompile(xmlChar *pattern,xmlDict *dict,int flags,xmlChar **namespaces)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  xmlPatOp xVar3;
  xmlDictPtr dict_00;
  xmlStreamStepPtr pxVar4;
  undefined8 uVar5;
  xmlChar *pxVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  xmlPatParserContextPtr ctxt;
  xmlPatternPtr ctxt_00;
  xmlStepOpPtr pxVar13;
  byte *pbVar14;
  xmlStreamCompPtr pxVar15;
  xmlChar xVar16;
  uint uVar17;
  byte *pbVar18;
  xmlChar *pxVar19;
  long lVar20;
  _xmlPattern *p_Var21;
  ulong uVar22;
  xmlChar *pxVar23;
  long lVar24;
  xmlPatternPtr pxVar25;
  xmlChar **ppxVar26;
  uint flags_00;
  xmlChar **in_R8;
  long lVar27;
  xmlPatternPtr comp;
  uint local_74;
  xmlChar *local_50;
  
  if (pattern == (xmlChar *)0x0) {
LAB_00169b35:
    comp = (xmlPatternPtr)0x0;
  }
  else {
    uVar10 = 0;
    uVar9 = flags | 0x200;
    comp = (xmlPatternPtr)0x0;
    local_74 = 1;
LAB_001690f0:
    xVar16 = *pattern;
    if (xVar16 != '\0') {
      lVar20 = 0;
      while (xVar16 != '\0') {
        if (xVar16 == '|') {
          local_50 = xmlStrndup(pattern,(int)lVar20);
          if (local_50 == (xmlChar *)0x0) {
            ctxt = (xmlPatParserContextPtr)0x0;
          }
          else {
            ctxt = xmlNewPatParserContext(local_50,dict,namespaces);
          }
          lVar20 = lVar20 + 1;
          goto LAB_00169177;
        }
        lVar24 = lVar20 + 1;
        lVar20 = lVar20 + 1;
        xVar16 = pattern[lVar24];
      }
      ctxt = xmlNewPatParserContext(pattern,dict,namespaces);
      local_50 = (xmlChar *)0x0;
LAB_00169177:
      pattern = pattern + lVar20;
      if (ctxt != (xmlPatParserContextPtr)0x0) {
        ctxt_00 = (xmlPatternPtr)(*xmlMalloc)(0x40);
        if (ctxt_00 != (xmlPatternPtr)0x0) {
          *(undefined1 (*) [16])&ctxt_00->flags = (undefined1  [16])0x0;
          ctxt_00->steps = (xmlStepOpPtr)0x0;
          ctxt_00->stream = (xmlStreamCompPtr)0x0;
          ctxt_00->next = (_xmlPattern *)0x0;
          ctxt_00->pattern = (xmlChar *)0x0;
          ctxt_00->data = (void *)0x0;
          ctxt_00->dict = (xmlDictPtr)0x0;
          ctxt_00->maxStep = 10;
          pxVar13 = (xmlStepOpPtr)(*xmlMalloc)(0xf0);
          ctxt_00->steps = pxVar13;
          if (pxVar13 == (xmlStepOpPtr)0x0) {
            (*xmlFree)(ctxt_00);
            goto LAB_00169aee;
          }
          if (dict != (xmlDict *)0x0) {
            ctxt_00->dict = dict;
            xmlDictReference(dict);
          }
          pxVar25 = ctxt_00;
          if (comp != (xmlPatternPtr)0x0) {
            ctxt_00->next = comp->next;
            comp->next = ctxt_00;
            pxVar25 = comp;
          }
          comp = pxVar25;
          ctxt_00->flags = flags;
          ctxt->comp = ctxt_00;
          pbVar14 = ctxt->cur;
          pbVar18 = pbVar14;
          if ((flags & 6U) != 0) {
            while( true ) {
              pbVar18 = pbVar18 + 1;
              uVar22 = (ulong)*pbVar14;
              if (0x2f < uVar22) break;
              if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                if (uVar22 == 0x2f) goto LAB_0016927c;
                break;
              }
              pbVar14 = pbVar14 + 1;
              ctxt->cur = pbVar14;
            }
            ctxt_00->flags = uVar9;
            if (*pbVar14 != 0x2e) goto LAB_001698df;
            while( true ) {
              ctxt->cur = pbVar18;
              uVar22 = (ulong)*pbVar18;
              if (0x2f < uVar22) break;
              if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                if (uVar22 == 0) {
                  iVar12 = xmlPatternAdd((xmlPatParserContextPtr)ctxt_00,(xmlPatternPtr)0x2,
                                         XML_OP_END,(xmlChar *)0x0,(xmlChar *)in_R8);
                  if (iVar12 == 0) goto LAB_00169284;
                }
                else if (uVar22 == 0x2f) goto LAB_0016954b;
                break;
              }
              pbVar18 = pbVar18 + 1;
            }
            goto LAB_0016927c;
          }
          while( true ) {
            pbVar18 = pbVar14 + 1;
            bVar8 = *pbVar14;
            uVar22 = (ulong)bVar8;
            if (0x2f < uVar22) break;
            if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
              uVar17 = uVar9;
              if ((uVar22 == 0x2e) || (uVar17 = flags | 0x100, uVar22 == 0x2f)) goto LAB_001695b0;
              break;
            }
            ctxt->cur = pbVar18;
            pbVar14 = pbVar18;
          }
          uVar17 = uVar9;
          if ((flags & 1U) != 0) {
LAB_001695b0:
            ctxt_00->flags = uVar17;
            bVar8 = *pbVar14;
          }
          if (bVar8 == 0x2e) {
            if ((*pbVar18 == 0x2f) && (pbVar14[2] == 0x2f)) {
              iVar12 = xmlPatternAdd((xmlPatParserContextPtr)ctxt_00,(xmlPatternPtr)&DAT_00000006,
                                     XML_OP_END,(xmlChar *)0x0,(xmlChar *)in_R8);
              if (iVar12 == 0) {
                pbVar18 = ctxt->cur;
                pbVar14 = pbVar18;
                if (*pbVar18 == 0) goto LAB_00169976;
                ctxt->cur = pbVar18 + 1;
                pbVar14 = pbVar18 + 1;
                if (pbVar18[1] == 0) goto LAB_00169976;
                ctxt->cur = pbVar18 + 2;
                pbVar14 = pbVar18 + 2;
                if (pbVar18[2] == 0) goto LAB_00169976;
                pbVar14 = pbVar18 + 3;
                while( true ) {
                  ctxt->cur = pbVar14;
LAB_00169976:
                  bVar8 = *pbVar14;
                  uVar22 = (ulong)bVar8;
                  if (0x20 < uVar22) goto LAB_00169680;
                  if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) break;
                  pbVar14 = pbVar14 + 1;
                }
                if (uVar22 != 0) goto LAB_00169680;
                goto LAB_0016927c;
              }
            }
            else {
LAB_001699c1:
              xmlCompileStepPattern(ctxt);
              if (ctxt->error == 0) {
                pbVar14 = ctxt->cur;
                while ((uVar22 = (ulong)*pbVar14, uVar22 < 0x21 &&
                       ((0x100002600U >> (uVar22 & 0x3f) & 1) != 0))) {
                  pbVar14 = pbVar14 + 1;
                  ctxt->cur = pbVar14;
                }
                while (xVar16 = (xmlChar)uVar22, xVar16 == '/') {
                  if (pbVar14[1] == 0x2f) {
                    iVar12 = xmlPatternAdd((xmlPatParserContextPtr)ctxt->comp,
                                           (xmlPatternPtr)&DAT_00000006,XML_OP_END,(xmlChar *)0x0,
                                           (xmlChar *)in_R8);
                    if (iVar12 != 0) goto LAB_00169284;
                    pbVar14 = ctxt->cur;
                    pbVar18 = pbVar14;
                    if (*pbVar14 == 0) goto LAB_00169a86;
                    ctxt->cur = pbVar14 + 1;
                    pbVar18 = pbVar14 + 1;
                    if (pbVar14[1] == 0) goto LAB_00169a86;
                    pbVar18 = pbVar14 + 2;
                    while( true ) {
                      ctxt->cur = pbVar18;
LAB_00169a86:
                      if ((0x20 < (ulong)*pbVar18) ||
                         ((0x100002600U >> ((ulong)*pbVar18 & 0x3f) & 1) == 0)) break;
                      pbVar18 = pbVar18 + 1;
                    }
                  }
                  else {
                    iVar12 = xmlPatternAdd((xmlPatParserContextPtr)ctxt->comp,
                                           (xmlPatternPtr)&DAT_00000005,XML_OP_END,(xmlChar *)0x0,
                                           (xmlChar *)in_R8);
                    if (iVar12 != 0) goto LAB_00169284;
                    pbVar14 = ctxt->cur;
                    if (*pbVar14 != 0) goto LAB_00169a73;
                    while (uVar22 = (ulong)*pbVar14, uVar22 < 0x21) {
                      if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                        if (uVar22 == 0) goto LAB_0016927c;
                        break;
                      }
LAB_00169a73:
                      pbVar14 = pbVar14 + 1;
                      ctxt->cur = pbVar14;
                    }
                  }
                  xmlCompileStepPattern(ctxt);
                  if (ctxt->error != 0) goto LAB_00169284;
                  pbVar14 = ctxt->cur;
                  uVar22 = (ulong)*pbVar14;
                }
                goto LAB_00169851;
              }
            }
          }
          else if (bVar8 == 0x2f) {
            pxVar25 = ctxt_00;
            if (*pbVar18 == 0x2f) {
              iVar12 = xmlPatternAdd((xmlPatParserContextPtr)ctxt_00,(xmlPatternPtr)&DAT_00000006,
                                     XML_OP_END,(xmlChar *)0x0,(xmlChar *)in_R8);
              if (iVar12 != 0) goto LAB_00169284;
              pxVar23 = ctxt->cur;
              if ((*pxVar23 == '\0') || (ctxt->cur = pxVar23 + 1, pxVar23[1] == '\0'))
              goto LAB_001699c1;
              pbVar14 = pxVar23 + 2;
              ctxt->cur = pbVar14;
              bVar8 = pxVar23[2];
              goto LAB_00169680;
            }
LAB_00169699:
            iVar12 = xmlPatternAdd((xmlPatParserContextPtr)pxVar25,(xmlPatternPtr)0x1,XML_OP_END,
                                   (xmlChar *)0x0,(xmlChar *)in_R8);
            if (iVar12 == 0) {
              pbVar14 = ctxt->cur;
              if (*pbVar14 != 0) goto LAB_001699af;
              while (uVar22 = (ulong)*pbVar14, uVar22 < 0x21) {
                if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                  if (uVar22 == 0) goto LAB_0016927c;
                  break;
                }
LAB_001699af:
                pbVar14 = pbVar14 + 1;
                ctxt->cur = pbVar14;
              }
              goto LAB_001699c1;
            }
          }
          else {
LAB_00169680:
            if (bVar8 != 0x40) {
              if (bVar8 != 0x2f) goto LAB_001699c1;
              pxVar25 = ctxt->comp;
              goto LAB_00169699;
            }
            ctxt->cur = pbVar14 + 1;
            xmlCompileAttributeTest(ctxt);
            pbVar14 = ctxt->cur;
            while( true ) {
              uVar22 = (ulong)*pbVar14;
              if (0x20 < uVar22) break;
              if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                if (uVar22 == 0) goto LAB_00169284;
                break;
              }
              ctxt->cur = pbVar14 + 1;
              pbVar14 = pbVar14 + 1;
            }
            xmlCompileStepPattern(ctxt);
            if (ctxt->error != 0) goto LAB_00169284;
            xVar16 = *ctxt->cur;
LAB_00169851:
            if (xVar16 != '\0') goto LAB_0016927c;
          }
          goto LAB_00169284;
        }
        goto LAB_00169aee;
      }
      goto LAB_00169b12;
    }
    p_Var21 = comp;
    if (local_74 == 0) {
      for (; p_Var21 != (xmlPatternPtr)0x0; p_Var21 = p_Var21->next) {
        if (p_Var21->stream != (xmlStreamCompPtr)0x0) {
          xmlFreeStreamComp(p_Var21->stream);
          p_Var21->stream = (xmlStreamCompPtr)0x0;
        }
      }
    }
  }
  return comp;
  while ((0x100002600U >> (uVar22 & 0x3f) & 1) != 0) {
LAB_0016954b:
    pbVar14 = pbVar18;
    pbVar18 = pbVar14 + 1;
    ctxt->cur = pbVar18;
    bVar8 = *pbVar18;
    uVar22 = (ulong)bVar8;
    if (0x2f < uVar22) goto LAB_001698d3;
  }
  if (uVar22 == 0x2f) {
    uVar22 = (ulong)*pbVar14;
    if (((0x20 < uVar22) || ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0)) &&
       (iVar12 = xmlPatternAdd((xmlPatParserContextPtr)ctxt_00,(xmlPatternPtr)&DAT_00000006,
                               XML_OP_END,(xmlChar *)0x0,(xmlChar *)in_R8), iVar12 == 0)) {
      pbVar14 = ctxt->cur;
      if (*pbVar14 != 0) goto LAB_001698ca;
      while( true ) {
        bVar8 = *pbVar14;
        if ((0x20 < (ulong)bVar8) || ((0x100002600U >> ((ulong)bVar8 & 0x3f) & 1) == 0)) break;
LAB_001698ca:
        pbVar14 = pbVar14 + 1;
        ctxt->cur = pbVar14;
      }
      goto LAB_001698d3;
    }
  }
  else {
LAB_001698d3:
    if (bVar8 != 0) {
LAB_001698df:
      do {
        xmlCompileStepPattern(ctxt);
        if (ctxt->error != 0) break;
        pbVar14 = ctxt->cur;
        while( true ) {
          uVar22 = (ulong)*pbVar14;
          if (0x2f < uVar22) goto LAB_0016927c;
          if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) break;
          ctxt->cur = pbVar14 + 1;
          pbVar14 = pbVar14 + 1;
        }
        if (uVar22 == 0) goto LAB_00169284;
        if ((uVar22 != 0x2f) ||
           (iVar12 = xmlPatternAdd((xmlPatParserContextPtr)ctxt->comp,(xmlPatternPtr)&DAT_00000005,
                                   XML_OP_END,(xmlChar *)0x0,(xmlChar *)in_R8), iVar12 != 0)) break;
        pbVar14 = ctxt->cur;
        if (*pbVar14 != 0) goto LAB_00169955;
        while (uVar22 = (ulong)*pbVar14, uVar22 < 0x30) {
          if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
            if ((uVar22 == 0) || (uVar22 == 0x2f)) goto LAB_0016927c;
            break;
          }
LAB_00169955:
          pbVar14 = pbVar14 + 1;
          ctxt->cur = pbVar14;
        }
      } while( true );
    }
  }
LAB_0016927c:
  ctxt->error = 1;
LAB_00169284:
  if (ctxt->error == 0) {
    *(undefined4 *)&ctxt->namespaces = 0xffffffff;
    *(undefined4 *)((long)&ctxt->namespaces + 4) = 0xffffffff;
    ctxt->nb_namespaces = -1;
    *(undefined4 *)&ctxt->field_0x3c = 0xffffffff;
    *(undefined4 *)&ctxt->comp = 0xffffffff;
    *(undefined4 *)((long)&ctxt->comp + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->elem = 0xffffffff;
    *(undefined4 *)((long)&ctxt->elem + 4) = 0xffffffff;
    ctxt->error = -1;
    *(undefined4 *)&ctxt->field_0x14 = 0xffffffff;
    *(undefined4 *)&ctxt->dict = 0xffffffff;
    *(undefined4 *)((long)&ctxt->dict + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->cur = 0xffffffff;
    *(undefined4 *)((long)&ctxt->cur + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->base = 0xffffffff;
    *(undefined4 *)((long)&ctxt->base + 4) = 0xffffffff;
    (*xmlFree)(ctxt);
    if (local_74 == 0) {
      local_74 = 0;
    }
    else {
      if (uVar10 == 0x200) {
        uVar17 = (uint)ctxt_00->flags >> 8 & 1;
        uVar10 = 0x200;
        local_74 = uVar17;
LAB_0016936a:
        local_74 = local_74 ^ 1;
        if (uVar17 != 0) goto LAB_00169701;
      }
      else {
        if (uVar10 == 0x100) {
          uVar17 = ctxt_00->flags & 0x200;
          uVar10 = 0x100;
          local_74 = uVar17 >> 9;
          goto LAB_0016936a;
        }
        local_74 = 1;
        if (uVar10 == 0) {
          uVar10 = ctxt_00->flags & 0x300;
          local_74 = 1;
        }
      }
      pxVar13 = ctxt_00->steps;
      if (pxVar13 != (xmlStepOpPtr)0x0) {
        if ((((ctxt_00->nbStep == 1) && (pxVar13->op == XML_OP_ELEM)) &&
            (pxVar13->value == (xmlChar *)0x0)) && (pxVar13->value2 == (xmlChar *)0x0)) {
          pxVar15 = xmlNewStreamComp(0);
          if (pxVar15 != (xmlStreamCompPtr)0x0) {
            pbVar14 = (byte *)((long)&pxVar15->flags + 1);
            *pbVar14 = *pbVar14 | 0x40;
            ctxt_00->stream = pxVar15;
          }
        }
        else {
          pxVar15 = xmlNewStreamComp(ctxt_00->nbStep / 2 + 1);
          if (pxVar15 != (xmlStreamCompPtr)0x0) {
            dict_00 = ctxt_00->dict;
            if (dict_00 != (xmlDictPtr)0x0) {
              pxVar15->dict = dict_00;
              xmlDictReference(dict_00);
            }
            if (((ulong)*(xmlPatternPtr *)&ctxt_00->flags & 0x100) != 0) {
              pbVar14 = (byte *)((long)&pxVar15->flags + 1);
              *pbVar14 = *pbVar14 | 0x80;
            }
            lVar20 = 0;
            bVar7 = false;
            flags_00 = 0;
            uVar17 = 0xffffffff;
            uVar11 = 0;
            for (uVar22 = 1; (long)(uVar22 - 1) < (long)ctxt_00->nbStep; uVar22 = uVar22 + 1) {
              pxVar13 = ctxt_00->steps;
              iVar12 = *(int *)((long)&pxVar13->op + lVar20);
              if (7 < iVar12 - 1U) goto switchD_0016943b_caseD_5;
              pxVar23 = *(xmlChar **)((long)&pxVar13->value + lVar20);
              pxVar19 = *(xmlChar **)((long)&pxVar13->value2 + lVar20);
              switch(iVar12) {
              case 1:
                bVar7 = true;
                if (lVar20 != 0) goto LAB_001696f4;
                break;
              case 2:
                if (pxVar23 != (xmlChar *)0x0 || pxVar19 != (xmlChar *)0x0)
                goto switchD_0016943b_caseD_3;
                if (flags_00 != 0 && uVar22 == (uint)ctxt_00->nbStep) {
                  pbVar14 = (byte *)((long)&pxVar15->flags + 1);
                  *pbVar14 = *pbVar14 | 0x40;
                  uVar11 = xmlStreamCompAddStep
                                     (pxVar15,(xmlChar *)0x0,(xmlChar *)0x0,100,flags_00 | 0x10);
                  if (-1 < (int)uVar11) {
                    if (uVar17 != 0xffffffff) {
                      pxVar15->steps[uVar17].flags = pxVar15->steps[uVar17].flags | 0x20;
                    }
                    goto LAB_00169508;
                  }
                  goto LAB_001696f4;
                }
                break;
              case 3:
switchD_0016943b_caseD_3:
                goto LAB_001694c9;
              case 4:
                uVar11 = xmlStreamCompAddStep(pxVar15,pxVar23,pxVar19,2,flags_00 | 8);
                if ((int)uVar11 < 0) goto LAB_001696f4;
LAB_00169508:
                flags_00 = 0;
                uVar17 = 0xffffffff;
                break;
              case 6:
                if (flags_00 == 0) {
                  if (((uint)pxVar15->flags >> 0x10 & 1) == 0) {
                    pxVar15->flags = pxVar15->flags | 0x10000;
                  }
                  flags_00 = 1;
                }
                break;
              case 7:
                pxVar19 = pxVar23;
                pxVar23 = (xmlChar *)0x0;
                goto LAB_001694c9;
              case 8:
                pxVar19 = (xmlChar *)0x0;
                pxVar23 = (xmlChar *)0x0;
LAB_001694c9:
                uVar11 = xmlStreamCompAddStep(pxVar15,pxVar23,pxVar19,1,flags_00);
                if ((int)uVar11 < 0) goto LAB_001696f4;
                flags_00 = 0;
                uVar17 = uVar11;
              }
switchD_0016943b_caseD_5:
              lVar20 = lVar20 + 0x18;
            }
            if ((!bVar7) && (((ulong)*(xmlPatternPtr *)&ctxt_00->flags & 7) == 0)) {
              if (((uint)pxVar15->flags >> 0x10 & 1) == 0) {
                pxVar15->flags = pxVar15->flags | 0x10000;
              }
              if (0 < pxVar15->nbStep) {
                uVar17 = pxVar15->steps->flags;
                if ((uVar17 & 1) == 0) {
                  pxVar15->steps->flags = uVar17 | 1;
                }
              }
            }
            if ((int)uVar11 < pxVar15->nbStep) {
              pxVar4 = pxVar15->steps;
              pxVar4[uVar11].flags = pxVar4[uVar11].flags | 2;
              if (bVar7) {
                *(byte *)&pxVar4->flags = (byte)pxVar4->flags | 4;
              }
              ctxt_00->stream = pxVar15;
            }
            else {
LAB_001696f4:
              xmlFreeStreamComp(pxVar15);
            }
          }
        }
      }
    }
LAB_00169701:
    uVar17 = ctxt_00->nbStep;
    pxVar13 = ctxt_00->steps;
    if ((0 < (int)uVar17) && (pxVar13->op == XML_OP_ANCESTOR)) {
      uVar17 = uVar17 - 1;
      for (lVar20 = 0; (ulong)uVar17 * 0x18 - lVar20 != 0; lVar20 = lVar20 + 0x18) {
        puVar1 = (undefined8 *)((long)&pxVar13[1].value + lVar20);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pxVar13->value + lVar20);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        *(undefined4 *)((long)&pxVar13->op + lVar20) =
             *(undefined4 *)((long)&pxVar13[1].op + lVar20);
      }
      ctxt_00->nbStep = uVar17;
    }
    if ((int)uVar17 < ctxt_00->maxStep) {
LAB_00169765:
      lVar24 = (long)(int)uVar17;
      ppxVar26 = &pxVar13->value;
      in_R8 = &pxVar13[lVar24 + -1].value;
      lVar20 = lVar24;
      for (lVar27 = 0; lVar20 = lVar20 + -1, lVar27 < lVar20; lVar27 = lVar27 + 1) {
        pxVar23 = *ppxVar26;
        pxVar19 = ppxVar26[1];
        pxVar6 = in_R8[1];
        *ppxVar26 = *in_R8;
        ppxVar26[1] = pxVar6;
        *in_R8 = pxVar23;
        in_R8[1] = pxVar19;
        xVar3 = ((xmlStepOp *)(ppxVar26 + -1))->op;
        ((xmlStepOp *)(ppxVar26 + -1))->op = ((xmlStepOp *)(in_R8 + -1))->op;
        ((xmlStepOp *)(in_R8 + -1))->op = xVar3;
        ppxVar26 = ppxVar26 + 3;
        in_R8 = in_R8 + -3;
      }
      pxVar13[lVar24].value = (xmlChar *)0x0;
      pxVar13[lVar24].value2 = (xmlChar *)0x0;
      ctxt_00->nbStep = uVar17 + 1;
      pxVar13[lVar24].op = XML_OP_END;
      if (local_50 != (xmlChar *)0x0) {
        (*xmlFree)(local_50);
      }
      goto LAB_001690f0;
    }
    pxVar13 = (xmlStepOpPtr)(*xmlRealloc)(pxVar13,(long)ctxt_00->maxStep * 0x30);
    if (pxVar13 != (xmlStepOpPtr)0x0) {
      ctxt_00->steps = pxVar13;
      ctxt_00->maxStep = ctxt_00->maxStep << 1;
      uVar17 = ctxt_00->nbStep;
      goto LAB_00169765;
    }
  }
  else {
LAB_00169aee:
    *(undefined4 *)&ctxt->namespaces = 0xffffffff;
    *(undefined4 *)((long)&ctxt->namespaces + 4) = 0xffffffff;
    ctxt->nb_namespaces = -1;
    *(undefined4 *)&ctxt->field_0x3c = 0xffffffff;
    *(undefined4 *)&ctxt->comp = 0xffffffff;
    *(undefined4 *)((long)&ctxt->comp + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->elem = 0xffffffff;
    *(undefined4 *)((long)&ctxt->elem + 4) = 0xffffffff;
    ctxt->error = -1;
    *(undefined4 *)&ctxt->field_0x14 = 0xffffffff;
    *(undefined4 *)&ctxt->dict = 0xffffffff;
    *(undefined4 *)((long)&ctxt->dict + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->cur = 0xffffffff;
    *(undefined4 *)((long)&ctxt->cur + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->base = 0xffffffff;
    *(undefined4 *)((long)&ctxt->base + 4) = 0xffffffff;
    (*xmlFree)(ctxt);
LAB_00169b12:
    if (comp == (xmlPatternPtr)0x0) goto LAB_00169b22;
  }
  xmlFreePatternList(comp);
LAB_00169b22:
  if (local_50 != (xmlChar *)0x0) {
    (*xmlFree)(local_50);
  }
  goto LAB_00169b35;
}

Assistant:

xmlPatternPtr
xmlPatterncompile(const xmlChar *pattern, xmlDict *dict, int flags,
                  const xmlChar **namespaces) {
    xmlPatternPtr ret = NULL, cur;
    xmlPatParserContextPtr ctxt = NULL;
    const xmlChar *or, *start;
    xmlChar *tmp = NULL;
    int type = 0;
    int streamable = 1;

    if (pattern == NULL)
        return(NULL);

    start = pattern;
    or = start;
    while (*or != 0) {
	tmp = NULL;
	while ((*or != 0) && (*or != '|')) or++;
        if (*or == 0)
	    ctxt = xmlNewPatParserContext(start, dict, namespaces);
	else {
	    tmp = xmlStrndup(start, or - start);
	    if (tmp != NULL) {
		ctxt = xmlNewPatParserContext(tmp, dict, namespaces);
	    }
	    or++;
	}
	if (ctxt == NULL) goto error;
	cur = xmlNewPattern();
	if (cur == NULL) goto error;
	/*
	* Assign string dict.
	*/
	if (dict) {
	    cur->dict = dict;
	    xmlDictReference(dict);
	}
	if (ret == NULL)
	    ret = cur;
	else {
	    cur->next = ret->next;
	    ret->next = cur;
	}
	cur->flags = flags;
	ctxt->comp = cur;

	if (XML_STREAM_XS_IDC(cur))
	    xmlCompileIDCXPathPath(ctxt);
	else
	    xmlCompilePathPattern(ctxt);
	if (ctxt->error != 0)
	    goto error;
	xmlFreePatParserContext(ctxt);
	ctxt = NULL;


        if (streamable) {
	    if (type == 0) {
	        type = cur->flags & (PAT_FROM_ROOT | PAT_FROM_CUR);
	    } else if (type == PAT_FROM_ROOT) {
	        if (cur->flags & PAT_FROM_CUR)
		    streamable = 0;
	    } else if (type == PAT_FROM_CUR) {
	        if (cur->flags & PAT_FROM_ROOT)
		    streamable = 0;
	    }
	}
	if (streamable)
	    xmlStreamCompile(cur);
	if (xmlReversePattern(cur) < 0)
	    goto error;
	if (tmp != NULL) {
	    xmlFree(tmp);
	    tmp = NULL;
	}
	start = or;
    }
    if (streamable == 0) {
        cur = ret;
	while (cur != NULL) {
	    if (cur->stream != NULL) {
		xmlFreeStreamComp(cur->stream);
		cur->stream = NULL;
	    }
	    cur = cur->next;
	}
    }

    return(ret);
error:
    if (ctxt != NULL) xmlFreePatParserContext(ctxt);
    if (ret != NULL) xmlFreePattern(ret);
    if (tmp != NULL) xmlFree(tmp);
    return(NULL);
}